

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3VMPrintf(sqlite3 *db,char *zFormat,__va_list_tag *ap)

{
  char *pcVar1;
  char zBase [70];
  sqlite3_str local_88;
  char local_68 [80];
  
  local_88.mxAlloc = db->aLimit[0];
  local_88.zText = local_68;
  local_88.nAlloc = 0x46;
  local_88.nChar = 0;
  local_88.accError = '\0';
  local_88.printfFlags = '\x01';
  local_88.db = db;
  sqlite3_str_vappendf(&local_88,zFormat,ap);
  pcVar1 = sqlite3StrAccumFinish(&local_88);
  if (local_88.accError == '\a') {
    sqlite3OomFault(db);
  }
  return pcVar1;
}

Assistant:

SQLITE_PRIVATE char *sqlite3VMPrintf(sqlite3 *db, const char *zFormat, va_list ap){
  char *z;
  char zBase[SQLITE_PRINT_BUF_SIZE];
  StrAccum acc;
  assert( db!=0 );
  sqlite3StrAccumInit(&acc, db, zBase, sizeof(zBase),
                      db->aLimit[SQLITE_LIMIT_LENGTH]);
  acc.printfFlags = SQLITE_PRINTF_INTERNAL;
  sqlite3_str_vappendf(&acc, zFormat, ap);
  z = sqlite3StrAccumFinish(&acc);
  if( acc.accError==SQLITE_NOMEM ){
    sqlite3OomFault(db);
  }
  return z;
}